

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

bool __thiscall
QTableModel::dropMimeData
          (QTableModel *this,QMimeData *data,DropAction action,int row,int column,QModelIndex *index
          )

{
  long lVar1;
  undefined1 uVar2;
  int iVar3;
  long *plVar4;
  int iVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((index->r < 0) || (iVar5 = index->c, iVar5 < 0)) ||
      (iVar3 = index->r, (index->m).ptr == (QAbstractItemModel *)0x0)) &&
     (iVar5 = 0, iVar3 = row, row == -1 || column == -1)) {
    iVar3 = (**(code **)(*(long *)this + 0x78))(this);
  }
  plVar4 = (long *)QMetaObject::cast((QObject *)&QTableWidget::staticMetaObject);
  if (plVar4 == (long *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (**(code **)(*plVar4 + 0x310))(plVar4,iVar3,iVar5,data,action);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)uVar2;
}

Assistant:

bool QTableModel::dropMimeData(const QMimeData *data, Qt::DropAction action,
                              int row , int column, const QModelIndex &index)
{
    if (index.isValid()) {
        row = index.row();
        column = index.column();
    } else if (row == -1 || column == -1) { // The user dropped outside the table.
        row = rowCount();
        column = 0;
    } else { // The user dropped between two rows
        // This means inserting a row, which only makes sense at column 0
        column = 0;
    }

    QTableWidget *view = this->view();
    return (view ? view->dropMimeData(row, column, data, action) : false);
}